

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int copy_from_lzss_window_to_unp(archive_read *a,void **buffer,int64_t startpos,size_t length)

{
  void *pvVar1;
  void *pvVar2;
  char *fmt;
  size_t sVar3;
  int error_number;
  long lVar4;
  void *__dest;
  ulong uVar5;
  uint uVar6;
  
  pvVar2 = a->format->data;
  if (length <= *(uint *)((long)pvVar2 + 0xd8)) {
    if (*(long *)((long)pvVar2 + 0xe0) == 0) {
      pvVar1 = malloc((ulong)*(uint *)((long)pvVar2 + 0xd8));
      *(void **)((long)pvVar2 + 0xe0) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        fmt = "Unable to allocate memory for uncompressed data.";
        error_number = 0xc;
        goto LAB_001429ab;
      }
    }
    uVar6 = (uint)startpos & *(uint *)((long)pvVar2 + 0x358);
    lVar4 = (long)(int)uVar6;
    uVar5 = (long)(int)*(uint *)((long)pvVar2 + 0x358) + 1;
    sVar3 = length;
    if (lVar4 + length <= uVar5) {
      __dest = (void *)((ulong)*(uint *)((long)pvVar2 + 0xd4) + *(long *)((long)pvVar2 + 0xe0));
      pvVar1 = (void *)(lVar4 + *(long *)((long)pvVar2 + 0x350));
LAB_00142a5f:
      memcpy(__dest,pvVar1,sVar3);
      uVar6 = (int)length + *(int *)((long)pvVar2 + 0xd4);
      *(uint *)((long)pvVar2 + 0xd4) = uVar6;
      if (uVar6 < *(uint *)((long)pvVar2 + 0xd8)) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = *(void **)((long)pvVar2 + 0xe0);
      }
      *buffer = pvVar2;
      return 0;
    }
    if ((length <= uVar5) && (uVar6 = (int)uVar5 - uVar6, -1 < (int)uVar6)) {
      uVar5 = (ulong)uVar6;
      __dest = (void *)((ulong)*(uint *)((long)pvVar2 + 0xd4) + *(long *)((long)pvVar2 + 0xe0));
      pvVar1 = (void *)(lVar4 + *(long *)((long)pvVar2 + 0x350));
      if (uVar5 <= length && length - uVar5 != 0) {
        memcpy(__dest,pvVar1,uVar5);
        __dest = (void *)((ulong)(uVar6 + *(int *)((long)pvVar2 + 0xd4)) +
                         *(long *)((long)pvVar2 + 0xe0));
        pvVar1 = *(void **)((long)pvVar2 + 0x350);
        sVar3 = length - uVar5;
      }
      goto LAB_00142a5f;
    }
  }
  fmt = "Bad RAR file data";
  error_number = 0x54;
LAB_001429ab:
  archive_set_error(&a->archive,error_number,fmt);
  return -0x1e;
}

Assistant:

static int
copy_from_lzss_window_to_unp(struct archive_read *a, const void **buffer,
                             int64_t startpos, size_t length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  if (length > rar->unp_buffer_size)
  {
    goto fatal;
  }

  if (!rar->unp_buffer)
  {
    if ((rar->unp_buffer = malloc(rar->unp_buffer_size)) == NULL)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
  }

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  if(windowoffs + length <= (size_t)lzss_size(&rar->lzss)) {
    memcpy(&rar->unp_buffer[rar->unp_offset], &rar->lzss.window[windowoffs],
           length);
  } else if (length <= (size_t)lzss_size(&rar->lzss)) {
    firstpart = lzss_size(&rar->lzss) - windowoffs;
    if (firstpart < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
    }
    if ((size_t)firstpart < length) {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], firstpart);
      memcpy(&rar->unp_buffer[rar->unp_offset + firstpart],
             &rar->lzss.window[0], length - firstpart);
    } else {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], length);
    }
  } else {
      goto fatal;
  }
  rar->unp_offset += (unsigned int) length;
  if (rar->unp_offset >= rar->unp_buffer_size)
    *buffer = rar->unp_buffer;
  else
    *buffer = NULL;
  return (ARCHIVE_OK);

fatal:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}